

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void av1_noop_first_pass_frame(AV1_COMP *cpi,int64_t ts_duration)

{
  int mb_cols;
  int mb_rows;
  long in_RDI;
  FRAME_STATS stats;
  FRAME_STATS *mb_stats;
  int unit_cols;
  int unit_rows;
  int max_mi_rows;
  int max_mi_cols;
  int max_mb_cols;
  int max_mb_rows;
  CommonModeInfoParams *mi_params;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  FirstPassData *in_stack_ffffffffffffff48;
  AV1_COMMON *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  mb_rows = *(int *)(in_RDI + 0x3c188);
  mb_cols = *(int *)(in_RDI + 0x3c18c);
  if (*(int *)(in_RDI + 0x42340) != 0) {
    in_stack_ffffffffffffffcc = size_in_mi(*(int *)(in_RDI + 0x42340));
    mb_cols = in_stack_ffffffffffffffcc + 2 >> 2;
  }
  if (*(int *)(in_RDI + 0x42344) != 0) {
    in_stack_ffffffffffffffc8 = size_in_mi(*(int *)(in_RDI + 0x42344));
    mb_rows = in_stack_ffffffffffffffc8 + 2 >> 2;
  }
  get_unit_rows(BLOCK_16X16,mb_rows);
  get_unit_cols(BLOCK_16X16,mb_cols);
  setup_firstpass_data
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
             in_stack_ffffffffffffff40);
  accumulate_frame_stats
            ((FRAME_STATS *)CONCAT44(mb_rows,mb_cols),in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  av1_free_firstpass_data((FirstPassData *)0x25bd79);
  update_firstpass_stats
            ((AV1_COMP *)mb_stats,(FRAME_STATS *)stats.brightness_factor,stats.intra_factor,
             stats.sum_mvcs._4_4_,stats.sum_mvrs,stats.sum_mvc_abs._3_1_);
  return;
}

Assistant:

void av1_noop_first_pass_frame(AV1_COMP *cpi, const int64_t ts_duration) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  int max_mb_rows = mi_params->mb_rows;
  int max_mb_cols = mi_params->mb_cols;
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_width) {
    int max_mi_cols = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_width);
    max_mb_cols = ROUND_POWER_OF_TWO(max_mi_cols, 2);
  }
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_height) {
    int max_mi_rows = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_height);
    max_mb_rows = ROUND_POWER_OF_TWO(max_mi_rows, 2);
  }
  const int unit_rows = get_unit_rows(BLOCK_16X16, max_mb_rows);
  const int unit_cols = get_unit_cols(BLOCK_16X16, max_mb_cols);
  setup_firstpass_data(cm, &cpi->firstpass_data, unit_rows, unit_cols);
  FRAME_STATS *mb_stats = cpi->firstpass_data.mb_stats;
  FRAME_STATS stats = accumulate_frame_stats(mb_stats, unit_rows, unit_cols);
  av1_free_firstpass_data(&cpi->firstpass_data);
  update_firstpass_stats(cpi, &stats, 1.0, current_frame->frame_number,
                         ts_duration, BLOCK_16X16);
}